

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O2

void testBadTypeAttributes(string *tempDir)

{
  ostream *poVar1;
  undefined1 in_CL;
  string *outputtype;
  string *outputtype_00;
  string *outputtype_01;
  string *outputtype_02;
  string *outputtype_03;
  string *outputtype_04;
  string *outputtype_05;
  string *outputtype_06;
  string *outputtype_07;
  string *outputtype_08;
  string *outputtype_09;
  string *outputtype_10;
  string *outputtype_11;
  string *outputtype_12;
  string *outputtype_13;
  string *outputtype_14;
  string *outputtype_15;
  string *outputtype_16;
  string *outputtype_17;
  string *outputtype_18;
  string *outputtype_19;
  string *outputtype_20;
  string *outputtype_21;
  string *outputtype_22;
  string *outputtype_23;
  char *inputtype;
  undefined1 *puVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing whether bad type attributes are fixed on read... ");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_43183::testTiledWithBadAttribute
            (
            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/tiled_with_scanlineimage_type.exr"
            );
  anon_unknown.dwarf_43183::testTiledWithBadAttribute
            (
            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/tiled_with_deepscanline_type.exr"
            );
  anon_unknown.dwarf_43183::testTiledWithBadAttribute
            (
            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/tiled_with_deeptile_type.exr"
            );
  anon_unknown.dwarf_43183::testScanLineWithBadAttribute
            (
            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/scanline_with_tiledimage_type.exr"
            );
  anon_unknown.dwarf_43183::testScanLineWithBadAttribute
            (
            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/scanline_with_deeptiled_type.exr"
            );
  anon_unknown.dwarf_43183::testScanLineWithBadAttribute
            (
            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/scanline_with_deepscanline_type.exr"
            );
  inputtype = "Testing whether bad type attributes are fixed on write... ";
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing whether bad type attributes are fixed on write... ");
  std::endl<char,std::char_traits<char>>(poVar1);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            ((anonymous_namespace)::NOTYPEATTR_abi_cxx11_,(string *)inputtype,outputtype,(bool)in_CL
            );
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            ((anonymous_namespace)::NOTYPEATTR_abi_cxx11_,(string *)inputtype,outputtype_00,
             (bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            ((anonymous_namespace)::NOTYPEATTR_abi_cxx11_,
             (string *)(anonymous_namespace)::NOTYPEATTR_abi_cxx11_,outputtype_01,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            ((anonymous_namespace)::NOTYPEATTR_abi_cxx11_,
             (string *)(anonymous_namespace)::NOTYPEATTR_abi_cxx11_,outputtype_02,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            ((anonymous_namespace)::NOTYPEATTR_abi_cxx11_,
             (string *)(anonymous_namespace)::NOTYPEATTR_abi_cxx11_,outputtype_03,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            (Imf_3_4::SCANLINEIMAGE_abi_cxx11_,(string *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_,
             outputtype_04,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::SCANLINEIMAGE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,
             outputtype_05,(bool)in_CL);
  puVar2 = Imf_3_4::TILEDIMAGE_abi_cxx11_;
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::SCANLINEIMAGE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,
             outputtype_06,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            (Imf_3_4::SCANLINEIMAGE_abi_cxx11_,(string *)puVar2,outputtype_07,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            (Imf_3_4::SCANLINEIMAGE_abi_cxx11_,(string *)puVar2,outputtype_08,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            (Imf_3_4::TILEDIMAGE_abi_cxx11_,(string *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_,
             outputtype_09,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::TILEDIMAGE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,outputtype_10,
             (bool)in_CL);
  puVar2 = Imf_3_4::TILEDIMAGE_abi_cxx11_;
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::TILEDIMAGE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,outputtype_11,
             (bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            (Imf_3_4::TILEDIMAGE_abi_cxx11_,(string *)puVar2,outputtype_12,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            (Imf_3_4::TILEDIMAGE_abi_cxx11_,(string *)puVar2,outputtype_13,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            (Imf_3_4::DEEPSCANLINE_abi_cxx11_,(string *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_,
             outputtype_14,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::DEEPSCANLINE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,outputtype_15
             ,(bool)in_CL);
  puVar2 = Imf_3_4::TILEDIMAGE_abi_cxx11_;
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::DEEPSCANLINE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,outputtype_16
             ,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            (Imf_3_4::DEEPSCANLINE_abi_cxx11_,(string *)puVar2,outputtype_17,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            (Imf_3_4::DEEPSCANLINE_abi_cxx11_,(string *)puVar2,outputtype_18,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
            (Imf_3_4::DEEPTILE_abi_cxx11_,(string *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_,outputtype_19,
             (bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::DEEPTILE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,outputtype_20,
             (bool)in_CL);
  puVar2 = Imf_3_4::TILEDIMAGE_abi_cxx11_;
  (anonymous_namespace)::check<Imf_3_4::TiledInputFile,Imf_3_4::TiledOutputFile>
            (Imf_3_4::DEEPTILE_abi_cxx11_,(string *)Imf_3_4::TILEDIMAGE_abi_cxx11_,outputtype_21,
             (bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
            (Imf_3_4::DEEPTILE_abi_cxx11_,(string *)puVar2,outputtype_22,(bool)in_CL);
  (anonymous_namespace)::check<Imf_3_4::DeepTiledInputFile,Imf_3_4::DeepTiledOutputFile>
            (Imf_3_4::DEEPTILE_abi_cxx11_,(string *)puVar2,outputtype_23,(bool)in_CL);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testBadTypeAttributes (const std::string& tempDir)
{
    cout << "Testing whether bad type attributes are fixed on read... " << endl;

    testTiledWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                               "tiled_with_scanlineimage_type.exr");
    testTiledWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                               "tiled_with_deepscanline_type.exr");
    testTiledWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                               "tiled_with_deeptile_type.exr");

    testScanLineWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                                  "scanline_with_tiledimage_type.exr");
    testScanLineWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                                  "scanline_with_deeptiled_type.exr");
    testScanLineWithBadAttribute (ILM_IMF_TEST_IMAGEDIR
                                  "scanline_with_deepscanline_type.exr");

    cout << "Testing whether bad type attributes are fixed on write... "
         << endl;

    testWriteBadTypes ();

    cout << "ok\n" << endl;
}